

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O1

void __thiscall FIX::Session::generateLogon(Session *this,Message *aLogon)

{
  pointer pcVar1;
  Message *message;
  EncryptMethod encryptMethod;
  HeartBtInt heartBtInt;
  long *local_160;
  long local_158;
  long local_150 [2];
  undefined1 local_140 [16];
  _Alloc_hider local_130;
  char local_120 [16];
  _Alloc_hider local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  size_t local_f0;
  int local_e8;
  undefined1 local_e0 [96];
  FieldBase local_80;
  
  local_e0._0_8_ = local_e0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"A","");
  message = newMessage(this,(string *)local_e0);
  if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
    operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
  }
  IntField::IntField((IntField *)local_e0,0x62);
  local_e0._0_8_ = &PTR__FieldBase_001ef050;
  IntField::IntField((IntField *)&local_80,0x6c);
  local_80._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001eed78;
  IntField::IntField((IntField *)local_140,0x62,0);
  local_140._0_8_ = &PTR__FieldBase_001ef050;
  FieldMap::setField(&message->super_FieldMap,(FieldBase *)local_140,true);
  FieldBase::~FieldBase((FieldBase *)local_140);
  if ((this->m_sessionID).m_isFIXT == true) {
    local_140._0_8_ = &PTR__FieldBase_001ed588;
    local_140._8_4_ = 0x471;
    local_130._M_p = local_120;
    pcVar1 = (this->m_senderDefaultApplVerID)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,pcVar1,
               pcVar1 + (this->m_senderDefaultApplVerID)._M_string_length);
    local_110._M_p = (pointer)&local_100;
    local_108 = 0;
    local_100._M_local_buf[0] = '\0';
    local_f0 = 0;
    local_e8 = 0;
    local_140._0_8_ = &PTR__FieldBase_001ef088;
    FieldMap::setField(&message->super_FieldMap,(FieldBase *)local_140,true);
    FieldBase::~FieldBase((FieldBase *)local_140);
  }
  if ((this->m_state).m_receivedReset == true) {
    BoolField::BoolField((BoolField *)local_140,0x8d,true);
    local_140._0_8_ = &PTR__FieldBase_001eee90;
    FieldMap::setField(&message->super_FieldMap,(FieldBase *)local_140,true);
    FieldBase::~FieldBase((FieldBase *)local_140);
  }
  FieldMap::getField(&aLogon->super_FieldMap,&local_80);
  local_160 = local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"A","");
  local_140._0_8_ = &PTR__FieldBase_001ed588;
  local_140._8_4_ = 0x23;
  local_130._M_p = local_120;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,local_160,local_158 + (long)local_160);
  local_110._M_p = (pointer)&local_100;
  local_108 = 0;
  local_100._M_local_buf[0] = '\0';
  local_f0 = 0;
  local_e8 = 0;
  local_140._0_8_ = &PTR__FieldBase_001ed708;
  FieldMap::setField(&(message->m_header).super_FieldMap,(FieldBase *)local_140,true);
  FieldBase::~FieldBase((FieldBase *)local_140);
  if (local_160 != local_150) {
    operator_delete(local_160,local_150[0] + 1);
  }
  FieldMap::setField(&message->super_FieldMap,&local_80,true);
  fill(this,&message->m_header);
  sendRaw(this,message,0);
  (this->m_state).m_sentLogon = true;
  FieldBase::~FieldBase(&local_80);
  FieldBase::~FieldBase((FieldBase *)local_e0);
  (*(message->super_FieldMap)._vptr_FieldMap[1])(message);
  return;
}

Assistant:

void Session::generateLogon( const Message& aLogon )
{
  SmartPtr<Message> pMsg(newMessage("A"));
  Message & logon = *pMsg;

  EncryptMethod encryptMethod;
  HeartBtInt heartBtInt;
  logon.setField( EncryptMethod( 0 ) );
  if( m_sessionID.isFIXT() )
    logon.setField( DefaultApplVerID(m_senderDefaultApplVerID) );  
  if( m_state.receivedReset() )
    logon.setField( ResetSeqNumFlag(true) );
  aLogon.getField( heartBtInt );
  logon.getHeader().setField( MsgType( "A" ) );
  logon.setField( heartBtInt );
  fill( logon.getHeader() );
  sendRaw( logon );
  m_state.sentLogon( true );
}